

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Dist::renderStereo(V2Dist *this,StereoSample *dest,StereoSample *src,int nsamples)

{
  uint32_t *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  anon_struct_8_2_9473106b_for_StereoSample_0 aVar5;
  
  if (this->mode - 5U < 5) {
    V2Flt::render(&this->fltl,dest->ch,src->ch,nsamples,2);
    V2Flt::render(&this->fltr,&(dest->field_0).r,&(src->field_0).r,nsamples,2);
    return;
  }
  if (this->mode == 4) {
    uVar3 = 0;
    uVar4 = (ulong)(uint)nsamples;
    if (nsamples < 1) {
      uVar4 = 0;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      aVar5 = src[uVar3].field_0;
      puVar1 = &this->dcount;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + this->dfreq;
      if (CARRY4(uVar2,this->dfreq)) {
        this->dvall = aVar5.l;
        this->dvalr = aVar5.r;
      }
      else {
        aVar5.r = 0.0;
        aVar5.l = this->dvall;
      }
      dest[uVar3].field_0.l = aVar5.l;
      *(float *)((long)dest + uVar3 * 8 + 4) = this->dvalr;
    }
    return;
  }
  renderMono(this,dest->ch,src->ch,nsamples * 2);
  return;
}

Assistant:

void renderStereo(StereoSample *dest, const StereoSample *src, int nsamples)
    {
        // @@@BUG this matches the original V2 code, but frankly I have my doubts
        // that always running the Moog filters in Mono mode is intentional...
        switch (mode)
        {
        case DECIMATOR:
            COVER("DIST stereo decimator");
            for (int i = 0; i < nsamples; i++)
            {
                decimator_tick(src[i].l, src[i].r);
                dest[i].l = dvall;
                dest[i].r = dvalr;
            }
            break;

        case FLT_LOW:
        case FLT_BAND:
        case FLT_HIGH:
        case FLT_NOTCH:
        case FLT_ALL:
            COVER("DIST stereo filter");
            fltl.render(&dest[0].l, &src[0].l, nsamples, 2);
            fltr.render(&dest[0].r, &src[0].r, nsamples, 2);
            break;

        default:
            // everything else we presume to be stateless and just pass through the
            // mono version.
            renderMono(&dest[0].l, &src[0].l, nsamples*2);
        }

        DEBUG_PLOT_STEREO(this, dest, nsamples);
    }